

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labelling.cc
# Opt level: O3

bool __thiscall labelling::Label::fullDominance(Label *this,Label *other,Directions *direction)

{
  bool bVar1;
  bool bVar2;
  undefined4 in_EAX;
  Directions flipped_direction;
  undefined8 uStack_28;
  
  uStack_28._0_4_ = in_EAX;
  bVar1 = checkDominance(this,other,direction);
  bVar2 = checkDominance(this,other,direction);
  if ((!bVar1) && (!bVar2)) {
    uStack_28 = (ulong)CONCAT14(*direction == FWD,(undefined4)uStack_28);
    bVar1 = checkDominance(this,other,(Directions *)((long)&uStack_28 + 4));
    if ((bVar1) || (this->weight <= other->weight && other->weight != this->weight)) {
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool Label::fullDominance(
    const Label&                     other,
    const bidirectional::Directions& direction) const {
  const bool& this_dominates  = checkDominance(other, direction);
  const bool& other_dominates = checkDominance(other, direction);

  if (this_dominates)
    return true;

  bool result = false;
  if (!this_dominates && !other_dominates) {
    bidirectional::Directions flipped_direction;
    if (direction == bidirectional::FWD)
      flipped_direction = bidirectional::BWD;
    else
      flipped_direction = bidirectional::FWD;
    const bool& this_dominates_flipped =
        checkDominance(other, flipped_direction);
    if (this_dominates_flipped || weight < other.weight)
      result = true;
  }
  return result;
}